

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index ts,Index last_ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  value_type_conflict1 *__value;
  sp_counted_base *psVar2;
  _func_int *p_Var3;
  BayesianGameWithClusterInfo *this_00;
  value_type pJVar4;
  stringstream *psVar5;
  TypeCluster *pTVar6;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_> *pvVar7;
  JointPolicyPureVectorForClusteredBG *this_01;
  Index last_ts_00;
  uint ts_00;
  PlanningUnitDecPOMDPDiscrete *pPVar8;
  int iVar9;
  Index IVar10;
  Index IVar11;
  const_reference ppJVar12;
  reference pvVar13;
  undefined4 extraout_var;
  size_t sVar14;
  long lVar15;
  ostream *poVar16;
  _Base_ptr p_Var17;
  undefined4 in_register_0000000c;
  ulong uVar18;
  ulong uVar19;
  Index *oIs;
  string *psVar20;
  _Self __tmp;
  Index IVar21;
  string local_138;
  allocator_type local_118 [32];
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_f8;
  _Rb_tree_node_base *local_e0;
  undefined1 *local_d8;
  ulong local_d0;
  value_type local_c8;
  stringstream *local_c0;
  ulong local_b8;
  TypeCluster *local_b0;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *local_a8;
  JointPolicyPureVectorForClusteredBG *local_a0;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  shared_count sStack_70;
  stringstream *local_68;
  Index local_5c;
  undefined8 local_58;
  Index local_4c;
  uint local_48;
  Index local_44;
  ulong local_40;
  PlanningUnitDecPOMDPDiscrete *local_38;
  
  local_58 = CONCAT44(in_register_0000000c,ts);
  psVar20 = &local_138;
  uVar19 = (ulong)ts;
  local_a8 = jpolBGVec;
  local_a0 = this;
  local_68 = ss;
  local_4c = last_ts;
  local_38 = pu;
  ppJVar12 = std::
             vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
             ::at(jpolBGVec,uVar19);
  local_c8 = *ppJVar12;
  pvVar13 = std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::at(bgVec,uVar19);
  this_00 = pvVar13->px;
  sStack_70.pi_ = (pvVar13->pn).pi_;
  psVar2 = (pvVar13->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  uVar18 = 0;
  local_b8 = (ulong)((int)local_58 - 1);
  local_48 = (int)local_58 + 1;
  local_c0 = local_68 + 0x10;
  local_d0 = uVar19 * 4 + 0xf & 0xfffffffffffffff0;
  while( true ) {
    p_Var3 = (local_38->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6];
    *(undefined8 *)((long)psVar20 + -8) = 0x3fc452;
    iVar9 = (*p_Var3)();
    if (CONCAT44(extraout_var,iVar9) <= uVar18) break;
    uVar19 = 0;
    local_40 = uVar18;
    while( true ) {
      IVar10 = (Index)local_40;
      *(undefined8 *)((long)psVar20 + -8) = 0x3fc474;
      sVar14 = BayesianGameBase::GetNrTypes
                         ((BayesianGameBase *)
                          &(this_00->super_BayesianGameForDecPOMDPStage).
                           super_BayesianGameIdenticalPayoff,IVar10);
      if (sVar14 <= uVar19) break;
      *(undefined8 *)((long)psVar20 + -8) = 0x3fc48d;
      local_b0 = BayesianGameWithClusterInfo::GetTypeCluster(this_00,IVar10,(Index)uVar19);
      p_Var17 = (local_b0->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_e0 = &(local_b0->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_44 = (Index)uVar19;
      while (p_Var17 != local_e0) {
        lVar15 = *(long *)(p_Var17 + 1);
        if (*(int *)(lVar15 + 8) == 1) {
          *(undefined8 *)((long)psVar20 + -8) = 0x3fc4d6;
          lVar15 = __dynamic_cast(lVar15,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
          pPVar8 = local_38;
          uVar19 = local_40;
          IVar10 = *(Index *)(lVar15 + 0xc);
          lVar15 = -local_d0;
          oIs = (Index *)(((long)psVar20 + lVar15) - local_d0);
          IVar11 = (Index)local_58;
          local_d8 = (undefined1 *)psVar20;
          local_5c = IVar10;
          oIs[-2] = 0x3fc513;
          oIs[-1] = 0;
          PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                    (&pPVar8->super_PlanningUnitMADPDiscrete,(Index)uVar19,IVar10,IVar11,
                     (Index *)((long)psVar20 + lVar15),oIs);
          observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_98 = (undefined1  [8])0x0;
          observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (IVar11 != 0) {
            __value = oIs + local_b8;
            oIs[-2] = 0x3fc54f;
            oIs[-1] = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,(ulong)*oIs
                       ,__value,local_118);
            oIs[-2] = 0x3fc55e;
            oIs[-1] = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,&local_138)
            ;
            oIs[-2] = 0x3fc566;
            oIs[-1] = 0;
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138);
            IVar11 = (Index)local_58;
          }
          pPVar8 = local_38;
          uVar19 = local_40;
          IVar21 = (Index)local_40;
          oIs[-2] = 0x3fc581;
          oIs[-1] = 0;
          IVar10 = PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                             (&pPVar8->super_PlanningUnitMADPDiscrete,IVar21,IVar11,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
          pJVar4 = local_c8;
          uVar18 = (ulong)local_44;
          p_Var3 = (local_c8->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13];
          oIs[-2] = 0x3fc59a;
          oIs[-1] = 0;
          IVar11 = (*p_Var3)(pJVar4,uVar19 & 0xffffffff,uVar18);
          pPVar8 = local_38;
          oIs[-2] = 0x3fc5b5;
          oIs[-1] = 0;
          PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
                    (&local_138,&pPVar8->super_PlanningUnitMADPDiscrete,IVar21,IVar10);
          psVar5 = local_c0;
          oIs[-2] = 0x3fc5c4;
          oIs[-1] = 0;
          poVar16 = std::operator<<((ostream *)psVar5,(string *)&local_138);
          oIs[-2] = 0x3fc5d3;
          oIs[-1] = 0;
          poVar16 = std::operator<<(poVar16," -> ");
          pPVar8 = local_38;
          uVar19 = local_40;
          p_Var3 = (local_38->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit
                   [0xc];
          oIs[-2] = 0x3fc5f0;
          oIs[-1] = 0;
          (*p_Var3)((string *)local_118,pPVar8,uVar19);
          oIs[-2] = 0x3fc5fb;
          oIs[-1] = 0;
          poVar16 = std::operator<<(poVar16,(string *)local_118);
          oIs[-2] = 0x3fc603;
          oIs[-1] = 0;
          std::endl<char,std::char_traits<char>>(poVar16);
          oIs[-2] = 0x3fc60f;
          oIs[-1] = 0;
          std::__cxx11::string::~string((string *)local_118);
          oIs[-2] = 0x3fc61b;
          oIs[-1] = 0;
          std::__cxx11::string::~string((string *)&local_138);
          if (local_48 <= local_4c) {
            oIs[-2] = 0x3fc633;
            oIs[-1] = 0;
            std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::vector(&local_f8,bgVec);
            uVar19 = local_40;
            ts_00 = local_48;
            last_ts_00 = local_4c;
            IVar21 = local_5c;
            this_01 = local_a0;
            pvVar7 = local_a8;
            pTVar6 = local_b0;
            oIs[-8] = IVar11;
            oIs[-0xe] = IVar10;
            *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              **)(oIs + -4) = &local_f8;
            *(TypeCluster **)(oIs + -0xc) = pTVar6;
            oIs[-0x10] = IVar21;
            pPVar8 = local_38;
            psVar5 = local_68;
            *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
              **)(oIs + -6) = pvVar7;
            oIs[-0x12] = 0x3fc68a;
            oIs[-0x11] = 0;
            RecursivelyPrintPolicyForAgent
                      (this_01,pPVar8,psVar5,(Index)uVar19,ts_00,last_ts_00,oIs[-0x10],oIs[-0xe],
                       *(TypeCluster **)(oIs + -0xc),oIs[-10],oIs[-8],
                       *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                         **)(oIs + -6),
                       *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                         **)(oIs + -4));
            oIs[-2] = 0x3fc696;
            oIs[-1] = 0;
            std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::~vector(&local_f8);
          }
          oIs[-2] = 0x3fc69e;
          oIs[-1] = 0;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          oIs[-2] = 0x3fc6ad;
          oIs[-1] = 0;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
          psVar20 = (string *)local_d8;
        }
        else {
          *(undefined8 *)((long)psVar20 + -8) = 0x3fc6c1;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
        }
      }
      uVar19 = (ulong)(local_44 + 1);
    }
    uVar18 = (ulong)(IVar10 + 1);
  }
  *(undefined8 *)((long)psVar20 + -8) = 0x3fc6e8;
  boost::detail::shared_count::~shared_count(&sStack_70);
  return;
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index ts
        , Index last_ts
        , const vector<const JointPolicyDiscretePure *>& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
        )const 
{
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure*  jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                {
                    //throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent - expected an AOHINDEX type");
                    it++;
                    continue;
                }
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                ss << pu->SoftPrintObservationHistory(agI, ohI) << " -> " <<
                    pu->SoftPrintAction(agI, aI) << endl;

                if(ts+1 <= last_ts)
                    RecursivelyPrintPolicyForAgent(
                        pu, ss, agI, ts+1, last_ts, aohI, 
                        ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}